

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O1

void lj_snap_add(jit_State *J)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  SnapEntry *pSVar4;
  IRIns *pIVar5;
  TValue *pTVar6;
  TRef TVar7;
  SnapEntry SVar8;
  SnapShot *pSVar9;
  TValue *pTVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  TValue *pTVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  
  uVar1 = (J->cur).nsnap;
  uVar11 = (ulong)uVar1;
  uVar3 = (J->cur).nsnapmap;
  uVar16 = (uint)uVar1;
  if (((uVar1 != 0) && ((J->cur).nins == (uint)(J->cur).snap[uVar11 - 1].ref)) ||
     ((J->mergesnap != '\0' && (-1 < (char)(J->guardemit).irt)))) {
    if (uVar16 != 1) {
      uVar11 = (ulong)(uVar16 - 1);
      uVar3 = (J->cur).snap[uVar11].mapofs;
      goto LAB_0012e8b2;
    }
    (J->fold).ins.field_0.ot = 0xc00;
    (J->fold).ins.field_1.op12 = 0;
    lj_ir_emit(J);
  }
  if (J->sizesnap <= uVar16) {
    lj_snap_grow_buf_(J,uVar1 + 1);
  }
  (J->cur).nsnap = (uint16_t)(uVar1 + 1);
LAB_0012e8b2:
  uVar16 = 0;
  J->mergesnap = '\0';
  (J->guardemit).irt = '\0';
  pSVar9 = (J->cur).snap + uVar11;
  uVar17 = J->maxslot + J->baseslot;
  uVar12 = uVar3 + uVar17 + 2;
  if (J->sizesnapmap < uVar12) {
    lj_snap_grow_map_(J,uVar12);
  }
  pSVar4 = (J->cur).snapmap;
  if (uVar17 != 0) {
    uVar1 = J->chain[0xb];
    iVar15 = 0;
    uVar18 = 0;
    uVar11 = 0;
    do {
      uVar16 = J->slot[uVar18];
      if (uVar18 == 1) {
        SVar8 = 0x1057fff;
        if ((uVar16 >> 0x10 & 1) != 0) goto LAB_0012ea19;
      }
      else {
        uVar12 = uVar16 & 0xffff;
        if (uVar12 == 0 && (uVar16 & 0x30000) != 0) {
          TVar7 = lj_ir_k64(J,IR_KNUM,J->L->base[uVar18 - J->baseslot].u64);
          uVar16 = uVar16 & 0xff0000 | TVar7;
          J->slot[uVar18] = uVar16;
          uVar12 = TVar7 & 0xffff;
        }
        if (uVar12 != 0) {
          SVar8 = iVar15 + (uVar16 & 0x13ffff);
          pIVar5 = (J->cur).ir;
          uVar13 = (ulong)uVar12;
          if (((*(char *)((long)pIVar5 + uVar13 * 8 + 5) == 'G') &&
              (uVar18 == pIVar5[uVar13].field_0.op1)) && (uVar1 < uVar12)) {
            uVar2 = *(ushort *)((long)pIVar5 + uVar13 * 8 + 2);
            if (((uVar2 & 0x20) == 0) &&
               (((uVar18 == 0 || ((ulong)uVar17 - 1 == uVar18)) ||
                ((*(byte *)((long)J->slot + uVar18 * 4 + 6) & 3) == 0)))) goto LAB_0012ea21;
            if ((uVar2 & 0x11) != 1) {
              SVar8 = iVar15 + 0x40000 + (uVar16 & 0x13ffff);
            }
          }
LAB_0012ea19:
          pSVar4[uVar3 + uVar11] = SVar8;
          uVar11 = (ulong)((int)uVar11 + 1);
        }
      }
LAB_0012ea21:
      uVar16 = (uint)uVar11;
      uVar18 = uVar18 + 1;
      iVar15 = iVar15 + 0x1000000;
    } while (uVar17 != uVar18);
  }
  pSVar9->nent = (uint8_t)uVar16;
  pTVar6 = J->L->base;
  pTVar10 = pTVar6 + -1;
  uVar12 = J->baseslot;
  if (*(char *)((pTVar6[-2].u64 & 0x7fffffffffff) + 10) == '\0') {
    pTVar14 = pTVar10 + *(byte *)(*(long *)((pTVar6[-2].u64 & 0x7fffffffffff) + 0x20) + -0x5d);
  }
  else {
    pTVar14 = J->L->top;
  }
  *(ulong *)(pSVar4 + (ulong)uVar3 + (ulong)uVar16) = (ulong)(uVar12 - 2) | (long)J->pc << 8;
  if (2 < uVar12) {
    do {
      uVar11 = pTVar10->u64;
      if ((uVar11 & 3) == 0) {
        pTVar10 = pTVar10 + (-2 - (ulong)*(byte *)(uVar11 - 3));
LAB_0012eaed:
        if (pTVar14 < pTVar10 + *(byte *)(*(long *)((pTVar10[-1].u64 & 0x7fffffffffff) + 0x20) +
                                         -0x5d)) {
          pTVar14 = pTVar10 + *(byte *)(*(long *)((pTVar10[-1].u64 & 0x7fffffffffff) + 0x20) + -0x5d
                                       );
        }
      }
      else {
        pTVar10 = (TValue *)((long)pTVar10 - (uVar11 & 0xfffffffffffffff8));
        if (((uint)uVar11 & 7) == 2) goto LAB_0012eaed;
      }
    } while (pTVar6 + (1 - (ulong)uVar12) < pTVar10);
  }
  pSVar9->topslot = (uint8_t)((uint)((int)pTVar14 - (int)(pTVar6 + (1 - (ulong)uVar12))) >> 3);
  pSVar9->mapofs = uVar3;
  pSVar9->ref = (IRRef1)(J->cur).nins;
  pSVar9->mcofs = 0;
  pSVar9->nslots = (uint8_t)uVar17;
  pSVar9->count = '\0';
  (J->cur).nsnapmap = uVar16 + uVar3 + 2;
  return;
}

Assistant:

void lj_snap_add(jit_State *J)
{
  MSize nsnap = J->cur.nsnap;
  MSize nsnapmap = J->cur.nsnapmap;
  /* Merge if no ins. inbetween or if requested and no guard inbetween. */
  if ((nsnap > 0 && J->cur.snap[nsnap-1].ref == J->cur.nins) ||
      (J->mergesnap && !irt_isguard(J->guardemit))) {
    if (nsnap == 1) {  /* But preserve snap #0 PC. */
      emitir_raw(IRT(IR_NOP, IRT_NIL), 0, 0);
      goto nomerge;
    }
    nsnapmap = J->cur.snap[--nsnap].mapofs;
  } else {
  nomerge:
    lj_snap_grow_buf(J, nsnap+1);
    J->cur.nsnap = (uint16_t)(nsnap+1);
  }
  J->mergesnap = 0;
  J->guardemit.irt = 0;
  snapshot_stack(J, &J->cur.snap[nsnap], nsnapmap);
}